

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cc
# Opt level: O3

int __thiscall Buffer::copy(Buffer *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  size_t __n;
  
  Buffer(this,*(size_t *)(*(long *)dst + 0x28));
  __n = *(size_t *)(*(long *)dst + 0x28);
  if (__n != 0) {
    memcpy(((this->m)._M_t.
            super___uniq_ptr_impl<Buffer::Members,_std::default_delete<Buffer::Members>_>._M_t.
            super__Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_>.
            super__Head_base<0UL,_Buffer::Members_*,_false>._M_head_impl)->buf,
           *(void **)(*(long *)dst + 0x30),__n);
  }
  return (int)this;
}

Assistant:

Buffer
Buffer::copy() const
{
    auto result = Buffer(m->size);
    if (m->size) {
        memcpy(result.m->buf, m->buf, m->size);
    }
    return result;
}